

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestCharReaderTestparseWithNoErrorsTestingOffsets::runTestCase
          (TestCharReaderTestparseWithNoErrorsTestingOffsets *this)

{
  int iVar1;
  CharReader *pCVar2;
  long lVar3;
  char *pcVar4;
  undefined8 *puVar5;
  byte bVar6;
  string errs;
  Value root;
  CharReaderBuilder b;
  char doc [111];
  undefined1 *local_100;
  long local_f8;
  undefined1 local_f0 [16];
  Value local_e0;
  CharReaderBuilder local_b8;
  undefined8 local_88 [13];
  undefined4 uStack_20;
  undefined1 auStack_1c [4];
  
  bVar6 = 0;
  Json::CharReaderBuilder::CharReaderBuilder(&local_b8);
  pCVar2 = Json::CharReaderBuilder::newCharReader(&local_b8);
  local_f8 = 0;
  local_f0[0] = 0;
  local_100 = local_f0;
  Json::Value::Value(&local_e0,nullValue);
  pcVar4 = 
  "{ \"property\" : [\"value\", \"value2\"], \"obj\" : { \"nested\" : 123, \"bool\" : true}, \"null\" : null, \"false\" : false }"
  ;
  puVar5 = local_88;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + ((ulong)bVar6 * -2 + 1) * 8;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  auStack_1c._0_3_ = 0x7d20;
  uStack_20 = 0x65736c61;
  iVar1 = (*pCVar2->_vptr_CharReader[2])(pCVar2,local_88,auStack_1c + 2,&local_e0,&local_100);
  if ((char)iVar1 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x73e,"ok");
  }
  if (local_f8 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x73f,"errs.size() == 0");
  }
  (*pCVar2->_vptr_CharReader[1])(pCVar2);
  Json::Value::~Value(&local_e0);
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
  Json::CharReaderBuilder::~CharReaderBuilder(&local_b8);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithNoErrorsTestingOffsets) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
                         "{ \"property\" : [\"value\", \"value2\"], \"obj\" : "
                         "{ \"nested\" : 123, \"bool\" : true}, \"null\" : "
                         "null, \"false\" : false }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs.size() == 0);
  delete reader;
}